

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
          (ArgBuilder *this,offset_in_ConfigData_to_bool field)

{
  BoundArgFunction<Catch::ConfigData> local_18;
  
  local_18.functionObj = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  (local_18.functionObj)->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_00166878;
  local_18.functionObj[1]._vptr_IArgFunction = (_func_int **)field;
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            ((BoundArgFunction<Catch::ConfigData> *)this->m_arg,&local_18);
  if (local_18.functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*(local_18.functionObj)->_vptr_IArgFunction[1])();
  }
  return;
}

Assistant:

void bind( bool C::* field ) {
                m_arg->boundField = new Detail::BoundDataMember<C,bool>( field );
            }